

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint readChunk_bKGD(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  uint uVar1;
  long lVar2;
  
  switch((info->color).colortype) {
  case LCT_GREY:
  case LCT_GREY_ALPHA:
    if (chunkLength != 2) {
      return 0x2c;
    }
    info->background_defined = 1;
    uVar1 = (uint)(ushort)(*(ushort *)data << 8 | *(ushort *)data >> 8);
    break;
  default:
    goto switchD_001ad805_caseD_1;
  case LCT_RGB:
  case LCT_RGBA:
    if (chunkLength != 6) {
      return 0x2d;
    }
    info->background_defined = 1;
    info->background_r = (uint)(ushort)(*(ushort *)data << 8 | *(ushort *)data >> 8);
    info->background_g = (uint)(ushort)(*(ushort *)(data + 2) << 8 | *(ushort *)(data + 2) >> 8);
    uVar1 = (uint)(ushort)(*(ushort *)(data + 4) << 8 | *(ushort *)(data + 4) >> 8);
    lVar2 = 0x44;
    goto LAB_001ad884;
  case LCT_PALETTE:
    if (chunkLength != 1) {
      return 0x2b;
    }
    info->background_defined = 1;
    uVar1 = (uint)*data;
  }
  info->background_b = uVar1;
  info->background_g = uVar1;
  lVar2 = 0x3c;
LAB_001ad884:
  *(uint *)((long)&info->compression_method + lVar2) = uVar1;
switchD_001ad805_caseD_1:
  return 0;
}

Assistant:

static unsigned readChunk_bKGD(LodePNGInfo* info, const unsigned char* data, size_t chunkLength)
{
  if(info->color.colortype == LCT_PALETTE)
  {
    /*error: this chunk must be 1 byte for indexed color image*/
    if(chunkLength != 1) return 43;

    info->background_defined = 1;
    info->background_r = info->background_g = info->background_b = data[0];
  }
  else if(info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA)
  {
    /*error: this chunk must be 2 bytes for greyscale image*/
    if(chunkLength != 2) return 44;

    info->background_defined = 1;
    info->background_r = info->background_g = info->background_b = 256u * data[0] + data[1];
  }
  else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA)
  {
    /*error: this chunk must be 6 bytes for greyscale image*/
    if(chunkLength != 6) return 45;

    info->background_defined = 1;
    info->background_r = 256u * data[0] + data[1];
    info->background_g = 256u * data[2] + data[3];
    info->background_b = 256u * data[4] + data[5];
  }

  return 0; /* OK */
}